

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo_linux.cpp
# Opt level: O2

quint64 mountIdForPath(int fd)

{
  int iVar1;
  long in_FS_OFFSET;
  statx st;
  undefined1 uStack_118;
  byte local_117;
  quint64 local_88;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < fd) {
    memset(&uStack_118,0xaa,0x100);
    iVar1 = statx(fd,"",0x1800,0x1000,&uStack_118);
    if ((iVar1 == 0) && ((local_117 & 0x10) != 0)) goto LAB_003ea3a8;
  }
  local_88 = 0;
LAB_003ea3a8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return local_88;
}

Assistant:

static inline quint64 mountIdForPath(int fd)
{
    if (fd < 0)
        return 0;
#if defined(STATX_BASIC_STATS) && defined(STATX_MNT_ID)
    // STATX_MNT_ID was added in kernel v5.8
    struct statx st;
    int r = statx(fd, "", AT_EMPTY_PATH | AT_NO_AUTOMOUNT, STATX_MNT_ID, &st);
    if (r == 0 && (st.stx_mask & STATX_MNT_ID))
        return st.stx_mnt_id;
#endif
    return 0;
}